

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSatOld.c
# Opt level: O1

int Cbs0_ManSolve(Cbs0_Man_t *p,Gia_Obj_t *pObj)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  int iVar9;
  long lVar10;
  
  if (((p->pProp).iHead != 0) || ((p->pProp).iTail != 0)) {
    __assert_fail("!p->pProp.iHead && !p->pProp.iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSatOld.c"
                  ,0x289,"int Cbs0_ManSolve(Cbs0_Man_t *, Gia_Obj_t *)");
  }
  if (((p->pJust).iHead != 0) || ((p->pJust).iTail != 0)) {
    __assert_fail("!p->pJust.iHead && !p->pJust.iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSatOld.c"
                  ,0x28a,"int Cbs0_ManSolve(Cbs0_Man_t *, Gia_Obj_t *)");
  }
  (p->Pars).nBTThis = 0;
  (p->Pars).nJustThis = 0;
  Cbs0_ManAssign(p,pObj);
  iVar6 = Cbs0_ManSolve_rec(p);
  if (((iVar6 == 0) && ((p->Pars).nJustThis <= (p->Pars).nJustLimit)) &&
     ((p->Pars).nBTThis <= (p->Pars).nBTLimit)) {
    pVVar3 = p->vModel;
    pVVar3->nSize = 0;
    (p->pProp).iHead = 0;
    if (0 < (p->pProp).iTail) {
      lVar10 = 0;
      do {
        pGVar4 = (p->pProp).pData[lVar10];
        if (pGVar4 == (Gia_Obj_t *)0x0) break;
        uVar5 = *(ulong *)pGVar4;
        if ((~(uint)uVar5 & 0x9fffffff) == 0) {
          if (((uint)uVar5 >> 0x1e & 1) == 0) {
            __assert_fail("pVar->fMark0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSatOld.c"
                          ,0x55,"int Cbs0_VarValue(Gia_Obj_t *)");
          }
          uVar1 = pVVar3->nCap;
          if (pVVar3->nSize == uVar1) {
            if ((int)uVar1 < 0x10) {
              if (pVVar3->pArray == (int *)0x0) {
                piVar8 = (int *)malloc(0x40);
              }
              else {
                piVar8 = (int *)realloc(pVVar3->pArray,0x40);
              }
              pVVar3->pArray = piVar8;
              iVar9 = 0x10;
            }
            else {
              iVar9 = uVar1 * 2;
              if (iVar9 <= (int)uVar1) goto LAB_00711675;
              if (pVVar3->pArray == (int *)0x0) {
                piVar8 = (int *)malloc((ulong)uVar1 << 3);
              }
              else {
                piVar8 = (int *)realloc(pVVar3->pArray,(ulong)uVar1 << 3);
              }
              pVVar3->pArray = piVar8;
            }
            if (piVar8 == (int *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            pVVar3->nCap = iVar9;
          }
LAB_00711675:
          iVar9 = pVVar3->nSize;
          pVVar3->nSize = iVar9 + 1;
          pVVar3->pArray[iVar9] =
               ((uint)(uVar5 >> 0x1f) & 0x3ffffffe | (uint)(uVar5 >> 0x3e) & 1) ^ 1;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < (p->pProp).iTail);
    }
  }
  iVar9 = (p->pProp).iTail;
  if (iVar9 < 0) {
    __assert_fail("iBound <= p->pProp.iTail",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSatOld.c"
                  ,0x1aa,"void Cbs0_ManCancelUntil(Cbs0_Man_t *, int)");
  }
  (p->pProp).iHead = 0;
  if (iVar9 != 0) {
    lVar10 = 0;
    do {
      pGVar4 = (p->pProp).pData[lVar10];
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      if (((uint)*(ulong *)pGVar4 >> 0x1e & 1) == 0) {
        __assert_fail("pVar->fMark0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSatOld.c"
                      ,0x54,"void Cbs0_VarUnassign(Gia_Obj_t *)");
      }
      *(ulong *)pGVar4 = *(ulong *)pGVar4 & 0xbfffffffbfffffff;
      lVar10 = lVar10 + 1;
    } while (lVar10 < (p->pProp).iTail);
  }
  (p->pProp).iTail = 0;
  (p->pJust).iHead = 0;
  (p->pJust).iTail = 0;
  iVar9 = (p->Pars).nBTThis;
  iVar2 = (p->Pars).nJustThis;
  piVar8 = &(p->Pars).nBTTotal;
  *piVar8 = *piVar8 + iVar9;
  iVar7 = (p->Pars).nJustTotal;
  if (iVar7 <= iVar2) {
    iVar7 = iVar2;
  }
  (p->Pars).nJustTotal = iVar7;
  iVar7 = -1;
  if ((iVar2 <= (p->Pars).nJustLimit) && (iVar7 = iVar6, (p->Pars).nBTLimit < iVar9)) {
    iVar7 = -1;
  }
  return iVar7;
}

Assistant:

int Cbs0_ManSolve( Cbs0_Man_t * p, Gia_Obj_t * pObj )
{
    int RetValue;
    assert( !p->pProp.iHead && !p->pProp.iTail );
    assert( !p->pJust.iHead && !p->pJust.iTail );
    p->Pars.nBTThis = p->Pars.nJustThis = 0;
    Cbs0_ManAssign( p, pObj );
    RetValue = Cbs0_ManSolve_rec( p );
    if ( RetValue == 0 && !Cbs0_ManCheckLimits(p) )
        Cbs0_ManSaveModel( p, p->vModel );
    Cbs0_ManCancelUntil( p, 0 );
    p->pJust.iHead = p->pJust.iTail = 0;
    p->Pars.nBTTotal += p->Pars.nBTThis;
    p->Pars.nJustTotal = Abc_MaxInt( p->Pars.nJustTotal, p->Pars.nJustThis );
    if ( Cbs0_ManCheckLimits( p ) )
        RetValue = -1;
//    printf( "Outcome = %2d.  Confs = %6d.  Decision level max = %3d.\n", 
//        RetValue, p->Pars.nBTThis, p->DecLevelMax );
    return RetValue;
}